

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

bool __thiscall
glslang::TOutputTraverser::visitAggregate
          (TOutputTraverser *this,TVisit param_1,TIntermAggregate *node)

{
  TOperator TVar1;
  TString *pTVar2;
  TInfoSinkBase *pTVar3;
  TString local_58;
  TInfoSink *local_30;
  TInfoSink *out;
  TIntermAggregate *node_local;
  TOutputTraverser *pTStack_18;
  TVisit param_1_local;
  TOutputTraverser *this_local;
  
  local_30 = this->infoSink;
  out = (TInfoSink *)node;
  node_local._4_4_ = param_1;
  pTStack_18 = this;
  TVar1 = TIntermOperator::getOp(&node->super_TIntermOperator);
  if (TVar1 != EOpNull) {
    OutputTreeText(local_30,(TIntermNode *)out,(this->super_TIntermTraverser).depth);
    TVar1 = TIntermOperator::getOp((TIntermOperator *)out);
    switch(TVar1) {
    case EOpSequence:
      TInfoSinkBase::operator<<(&local_30->debug,"Sequence\n");
      return true;
    case EOpScope:
      TInfoSinkBase::operator<<(&local_30->debug,"Scope\n");
      return true;
    case EOpLinkerObjects:
      TInfoSinkBase::operator<<(&local_30->debug,"Linker Objects\n");
      return true;
    case EOpFunctionCall:
      pTVar3 = TInfoSinkBase::operator<<(&local_30->debug,"Function Call: ");
      pTVar2 = (TString *)(**(code **)(*(long *)&(out->info).sink + 0x1a8))();
      TInfoSinkBase::operator<<(pTVar3,pTVar2);
      break;
    case EOpFunction:
      pTVar3 = TInfoSinkBase::operator<<(&local_30->debug,"Function Definition: ");
      pTVar2 = (TString *)(**(code **)(*(long *)&(out->info).sink + 0x1a8))();
      TInfoSinkBase::operator<<(pTVar3,pTVar2);
      break;
    case EOpParameters:
      TInfoSinkBase::operator<<(&local_30->debug,"Function Parameters: ");
      break;
    case EOpSpirvInst:
      TInfoSinkBase::operator<<(&local_30->debug,"spirv_instruction");
      break;
    default:
      TInfoSinkBase::message(&local_30->debug,EPrefixError,"Bad aggregation op");
      break;
    case EOpMul:
      TInfoSinkBase::operator<<(&local_30->debug,"component-wise multiply");
      break;
    case EOpMod:
      TInfoSinkBase::operator<<(&local_30->debug,"mod");
      break;
    case EOpVectorEqual:
      TInfoSinkBase::operator<<(&local_30->debug,"Equal");
      break;
    case EOpVectorNotEqual:
      TInfoSinkBase::operator<<(&local_30->debug,"NotEqual");
      break;
    case EOpLessThan:
      TInfoSinkBase::operator<<(&local_30->debug,"Compare Less Than");
      break;
    case EOpGreaterThan:
      TInfoSinkBase::operator<<(&local_30->debug,"Compare Greater Than");
      break;
    case EOpLessThanEqual:
      TInfoSinkBase::operator<<(&local_30->debug,"Compare Less Than or Equal");
      break;
    case EOpGreaterThanEqual:
      TInfoSinkBase::operator<<(&local_30->debug,"Compare Greater Than or Equal");
      break;
    case EOpComma:
      TInfoSinkBase::operator<<(&local_30->debug,"Comma");
      break;
    case EOpAtan:
      TInfoSinkBase::operator<<(&local_30->debug,"arc tangent");
      break;
    case EOpPow:
      TInfoSinkBase::operator<<(&local_30->debug,"pow");
      break;
    case EOpModf:
      TInfoSinkBase::operator<<(&local_30->debug,"modf");
      break;
    case EOpMin:
      TInfoSinkBase::operator<<(&local_30->debug,"min");
      break;
    case EOpMax:
      TInfoSinkBase::operator<<(&local_30->debug,"max");
      break;
    case EOpClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"clamp");
      break;
    case EOpMix:
      TInfoSinkBase::operator<<(&local_30->debug,"mix");
      break;
    case EOpStep:
      TInfoSinkBase::operator<<(&local_30->debug,"step");
      break;
    case EOpSmoothStep:
      TInfoSinkBase::operator<<(&local_30->debug,"smoothstep");
      break;
    case EOpFma:
      TInfoSinkBase::operator<<(&local_30->debug,"fma");
      break;
    case EOpFrexp:
      TInfoSinkBase::operator<<(&local_30->debug,"frexp");
      break;
    case EOpLdexp:
      TInfoSinkBase::operator<<(&local_30->debug,"ldexp");
      break;
    case EOpDistance:
      TInfoSinkBase::operator<<(&local_30->debug,"distance");
      break;
    case EOpDot:
      TInfoSinkBase::operator<<(&local_30->debug,"dot-product");
      break;
    case EOpCross:
      TInfoSinkBase::operator<<(&local_30->debug,"cross-product");
      break;
    case EOpFaceForward:
      TInfoSinkBase::operator<<(&local_30->debug,"face-forward");
      break;
    case EOpReflect:
      TInfoSinkBase::operator<<(&local_30->debug,"reflect");
      break;
    case EOpRefract:
      TInfoSinkBase::operator<<(&local_30->debug,"refract");
      break;
    case EOpMin3:
      TInfoSinkBase::operator<<(&local_30->debug,"min3");
      break;
    case EOpMax3:
      TInfoSinkBase::operator<<(&local_30->debug,"max3");
      break;
    case EOpMid3:
      TInfoSinkBase::operator<<(&local_30->debug,"mid3");
      break;
    case EOpInterpolateAtSample:
      TInfoSinkBase::operator<<(&local_30->debug,"interpolateAtSample");
      break;
    case EOpInterpolateAtOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"interpolateAtOffset");
      break;
    case EOpInterpolateAtVertex:
      TInfoSinkBase::operator<<(&local_30->debug,"interpolateAtVertex");
      break;
    case EOpOuterProduct:
      TInfoSinkBase::operator<<(&local_30->debug,"outer product");
      break;
    case EOpEmitVertex:
      TInfoSinkBase::operator<<(&local_30->debug,"EmitVertex");
      break;
    case EOpEndPrimitive:
      TInfoSinkBase::operator<<(&local_30->debug,"EndPrimitive");
      break;
    case EOpBarrier:
      TInfoSinkBase::operator<<(&local_30->debug,"Barrier");
      break;
    case EOpMemoryBarrier:
      TInfoSinkBase::operator<<(&local_30->debug,"MemoryBarrier");
      break;
    case EOpMemoryBarrierAtomicCounter:
      TInfoSinkBase::operator<<(&local_30->debug,"MemoryBarrierAtomicCounter");
      break;
    case EOpMemoryBarrierBuffer:
      TInfoSinkBase::operator<<(&local_30->debug,"MemoryBarrierBuffer");
      break;
    case EOpMemoryBarrierImage:
      TInfoSinkBase::operator<<(&local_30->debug,"MemoryBarrierImage");
      break;
    case EOpMemoryBarrierShared:
      TInfoSinkBase::operator<<(&local_30->debug,"MemoryBarrierShared");
      break;
    case EOpGroupMemoryBarrier:
      TInfoSinkBase::operator<<(&local_30->debug,"GroupMemoryBarrier");
      break;
    case EOpReadInvocation:
      TInfoSinkBase::operator<<(&local_30->debug,"readInvocation");
      break;
    case EOpSubgroupBarrier:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBarrier");
      break;
    case EOpSubgroupMemoryBarrier:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMemoryBarrier");
      break;
    case EOpSubgroupMemoryBarrierBuffer:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMemoryBarrierBuffer");
      break;
    case EOpSubgroupMemoryBarrierImage:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMemoryBarrierImage");
      break;
    case EOpSubgroupMemoryBarrierShared:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMemoryBarrierShared");
      break;
    case EOpSubgroupElect:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupElect");
      break;
    case EOpSubgroupAll:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAll");
      break;
    case EOpSubgroupAny:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAny");
      break;
    case EOpSubgroupAllEqual:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAllEqual");
      break;
    case EOpSubgroupBroadcast:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBroadcast");
      break;
    case EOpSubgroupBroadcastFirst:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBroadcastFirst");
      break;
    case EOpSubgroupBallot:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallot");
      break;
    case EOpSubgroupInverseBallot:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInverseBallot");
      break;
    case EOpSubgroupBallotBitExtract:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotBitExtract");
      break;
    case EOpSubgroupBallotBitCount:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotBitCount");
      break;
    case EOpSubgroupBallotInclusiveBitCount:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotInclusiveBitCount");
      break;
    case EOpSubgroupBallotExclusiveBitCount:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotExclusiveBitCount");
      break;
    case EOpSubgroupBallotFindLSB:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotFindLSB");
      break;
    case EOpSubgroupBallotFindMSB:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupBallotFindMSB");
      break;
    case EOpSubgroupShuffle:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffle");
      break;
    case EOpSubgroupShuffleXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffleXor");
      break;
    case EOpSubgroupShuffleUp:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffleUp");
      break;
    case EOpSubgroupShuffleDown:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupShuffleDown");
      break;
    case EOpSubgroupRotate:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupRotate");
      break;
    case EOpSubgroupClusteredRotate:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredRotate");
      break;
    case EOpSubgroupAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAdd");
      break;
    case EOpSubgroupMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMul");
      break;
    case EOpSubgroupMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMin");
      break;
    case EOpSubgroupMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupMax");
      break;
    case EOpSubgroupAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupAnd");
      break;
    case EOpSubgroupOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupOr");
      break;
    case EOpSubgroupXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupXor");
      break;
    case EOpSubgroupInclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveAdd");
      break;
    case EOpSubgroupInclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveMul");
      break;
    case EOpSubgroupInclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveMin");
      break;
    case EOpSubgroupInclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveMax");
      break;
    case EOpSubgroupInclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveAnd");
      break;
    case EOpSubgroupInclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveOr");
      break;
    case EOpSubgroupInclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupInclusiveXor");
      break;
    case EOpSubgroupExclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveAdd");
      break;
    case EOpSubgroupExclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveMul");
      break;
    case EOpSubgroupExclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveMin");
      break;
    case EOpSubgroupExclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveMax");
      break;
    case EOpSubgroupExclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveAnd");
      break;
    case EOpSubgroupExclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveOr");
      break;
    case EOpSubgroupExclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupExclusiveXor");
      break;
    case EOpSubgroupClusteredAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredAdd");
      break;
    case EOpSubgroupClusteredMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredMul");
      break;
    case EOpSubgroupClusteredMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredMin");
      break;
    case EOpSubgroupClusteredMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredMax");
      break;
    case EOpSubgroupClusteredAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredAnd");
      break;
    case EOpSubgroupClusteredOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredOr");
      break;
    case EOpSubgroupClusteredXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupClusteredXor");
      break;
    case EOpSubgroupQuadBroadcast:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadBroadcast");
      break;
    case EOpSubgroupQuadSwapHorizontal:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadSwapHorizontal");
      break;
    case EOpSubgroupQuadSwapVertical:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadSwapVertical");
      break;
    case EOpSubgroupQuadSwapDiagonal:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadSwapDiagonal");
      break;
    case EOpSubgroupQuadAll:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadAll");
      break;
    case EOpSubgroupQuadAny:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupQuadAny");
      break;
    case EOpSubgroupPartition:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionNV");
      break;
    case EOpSubgroupPartitionedAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedAddNV");
      break;
    case EOpSubgroupPartitionedMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedMulNV");
      break;
    case EOpSubgroupPartitionedMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedMinNV");
      break;
    case EOpSubgroupPartitionedMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedMaxNV");
      break;
    case EOpSubgroupPartitionedAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedAndNV");
      break;
    case EOpSubgroupPartitionedOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedOrNV");
      break;
    case EOpSubgroupPartitionedXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedXorNV");
      break;
    case EOpSubgroupPartitionedInclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveAddNV");
      break;
    case EOpSubgroupPartitionedInclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveMulNV");
      break;
    case EOpSubgroupPartitionedInclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveMinNV");
      break;
    case EOpSubgroupPartitionedInclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveMaxNV");
      break;
    case EOpSubgroupPartitionedInclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveAndNV");
      break;
    case EOpSubgroupPartitionedInclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveOrNV");
      break;
    case EOpSubgroupPartitionedInclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedInclusiveXorNV");
      break;
    case EOpSubgroupPartitionedExclusiveAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveAddNV");
      break;
    case EOpSubgroupPartitionedExclusiveMul:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveMulNV");
      break;
    case EOpSubgroupPartitionedExclusiveMin:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveMinNV");
      break;
    case EOpSubgroupPartitionedExclusiveMax:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveMaxNV");
      break;
    case EOpSubgroupPartitionedExclusiveAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveAndNV");
      break;
    case EOpSubgroupPartitionedExclusiveOr:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveOrNV");
      break;
    case EOpSubgroupPartitionedExclusiveXor:
      TInfoSinkBase::operator<<(&local_30->debug,"subgroupPartitionedExclusiveXorNV");
      break;
    case EOpDotPackedEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"dot-product-packed");
      break;
    case EOpDotAccSatEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"dot-product-accumulate-saturate");
      break;
    case EOpDotPackedAccSatEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"dot-product-packed-accumulate-saturate");
      break;
    case EOpSwizzleInvocations:
      TInfoSinkBase::operator<<(&local_30->debug,"swizzleInvocations");
      break;
    case EOpSwizzleInvocationsMasked:
      TInfoSinkBase::operator<<(&local_30->debug,"swizzleInvocationsMasked");
      break;
    case EOpWriteInvocation:
      TInfoSinkBase::operator<<(&local_30->debug,"writeInvocation");
      break;
    case EOpTime:
      TInfoSinkBase::operator<<(&local_30->debug,"time");
      break;
    case EOpAtomicAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicAdd");
      break;
    case EOpAtomicSubtract:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicSubtract");
      break;
    case EOpAtomicMin:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicMin");
      break;
    case EOpAtomicMax:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicMax");
      break;
    case EOpAtomicAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicAnd");
      break;
    case EOpAtomicOr:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicOr");
      break;
    case EOpAtomicXor:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicXor");
      break;
    case EOpAtomicExchange:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicExchange");
      break;
    case EOpAtomicCompSwap:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCompSwap");
      break;
    case EOpAtomicLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicLoad");
      break;
    case EOpAtomicStore:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicStore");
      break;
    case EOpAtomicCounterAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterAdd");
      break;
    case EOpAtomicCounterSubtract:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterSubtract");
      break;
    case EOpAtomicCounterMin:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterMin");
      break;
    case EOpAtomicCounterMax:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterMax");
      break;
    case EOpAtomicCounterAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterAnd");
      break;
    case EOpAtomicCounterOr:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterOr");
      break;
    case EOpAtomicCounterXor:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterXor");
      break;
    case EOpAtomicCounterExchange:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterExchange");
      break;
    case EOpAtomicCounterCompSwap:
      TInfoSinkBase::operator<<(&local_30->debug,"AtomicCounterCompSwap");
      break;
    case EOpCooperativeMatrixLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"Load cooperative matrix KHR");
      break;
    case EOpCooperativeMatrixStore:
      TInfoSinkBase::operator<<(&local_30->debug,"Store cooperative matrix KHR");
      break;
    case EOpCooperativeMatrixMulAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"MulAdd cooperative matrices KHR");
      break;
    case EOpCooperativeMatrixLoadNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Load cooperative matrix NV");
      break;
    case EOpCooperativeMatrixStoreNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Store cooperative matrix NV");
      break;
    case EOpCooperativeMatrixLoadTensorNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Load cooperative matrix tensor NV");
      break;
    case EOpCooperativeMatrixStoreTensorNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Store cooperative matrix tensor NV");
      break;
    case EOpCooperativeMatrixMulAddNV:
      TInfoSinkBase::operator<<(&local_30->debug,"MulAdd cooperative matrices NV");
      break;
    case EOpCooperativeMatrixReduceNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Reduce cooperative matrices");
      break;
    case EOpCooperativeMatrixPerElementOpNV:
      TInfoSinkBase::operator<<(&local_30->debug,"cooperative matrix per element op");
      break;
    case EOpCooperativeMatrixTransposeNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Transpose cooperative matrix");
      break;
    case EOpCreateTensorLayoutNV:
      TInfoSinkBase::operator<<(&local_30->debug,"createTensorLayout");
      break;
    case EOpTensorLayoutSetBlockSizeNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setBlockSize");
      break;
    case EOpTensorLayoutSetDimensionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setDimension");
      break;
    case EOpTensorLayoutSetStrideNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setStride");
      break;
    case EOpTensorLayoutSliceNV:
      TInfoSinkBase::operator<<(&local_30->debug,"slice");
      break;
    case EOpTensorLayoutSetClampValueNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setClampValue");
      break;
    case EOpCreateTensorViewNV:
      TInfoSinkBase::operator<<(&local_30->debug,"createTensorView");
      break;
    case EOpTensorViewSetDimensionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorViewDimensions");
      break;
    case EOpTensorViewSetStrideNV:
      TInfoSinkBase::operator<<(&local_30->debug,"setTensorViewStride");
      break;
    case EOpTensorViewSetClipNV:
      TInfoSinkBase::operator<<(&local_30->debug,"clipTensorView");
      break;
    case EOpCooperativeVectorMatMulNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Cooperative vector matrix multiply NV");
      break;
    case EOpCooperativeVectorMatMulAddNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Cooperative vector matrix multiply add NV");
      break;
    case EOpCooperativeVectorLoadNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Load cooperative vector NV");
      break;
    case EOpCooperativeVectorStoreNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Store cooperative vector NV");
      break;
    case EOpCooperativeVectorOuterProductAccumulateNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Cooperative vector outer product accumulate NV");
      break;
    case EOpCooperativeVectorReduceSumAccumulateNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Cooperative vector reduce sum accumulate NV");
      break;
    case EOpIsHelperInvocation:
      TInfoSinkBase::operator<<(&local_30->debug,"IsHelperInvocation");
      break;
    case EOpDebugPrintf:
      TInfoSinkBase::operator<<(&local_30->debug,"Debug printf");
      break;
    case EOpTerminateRayKHR:
      TInfoSinkBase::operator<<(&local_30->debug,"terminateRayKHR");
      break;
    case EOpIgnoreIntersectionKHR:
      TInfoSinkBase::operator<<(&local_30->debug,"ignoreIntersectionKHR");
      break;
    case EOpConstructInt:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct int");
      break;
    case EOpConstructUint:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct uint");
      break;
    case EOpConstructInt8:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct int8_t");
      break;
    case EOpConstructUint8:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct uint8_t");
      break;
    case EOpConstructInt16:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct int16_t");
      break;
    case EOpConstructUint16:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct uint16_t");
      break;
    case EOpConstructInt64:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct int64");
      break;
    case EOpConstructUint64:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct uint64");
      break;
    case EOpConstructBool:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bool");
      break;
    case EOpConstructFloat:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct float");
      break;
    case EOpConstructDouble:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct double");
      break;
    case EOpConstructVec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct vec2");
      break;
    case EOpConstructVec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct vec3");
      break;
    case EOpConstructVec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct vec4");
      break;
    case EOpConstructMat2x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat2");
      break;
    case EOpConstructMat2x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat2x3");
      break;
    case EOpConstructMat2x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat2x4");
      break;
    case EOpConstructMat3x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat3x2");
      break;
    case EOpConstructMat3x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat3");
      break;
    case EOpConstructMat3x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat3x4");
      break;
    case EOpConstructMat4x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat4x2");
      break;
    case EOpConstructMat4x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat4x3");
      break;
    case EOpConstructMat4x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct mat4");
      break;
    case EOpConstructDVec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dvec2");
      break;
    case EOpConstructDVec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dvec3");
      break;
    case EOpConstructDVec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dvec4");
      break;
    case EOpConstructBVec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bvec2");
      break;
    case EOpConstructBVec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bvec3");
      break;
    case EOpConstructBVec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bvec4");
      break;
    case EOpConstructI8Vec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i8vec2");
      break;
    case EOpConstructI8Vec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i8vec3");
      break;
    case EOpConstructI8Vec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i8vec4");
      break;
    case EOpConstructU8Vec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u8vec2");
      break;
    case EOpConstructU8Vec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u8vec3");
      break;
    case EOpConstructU8Vec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u8vec4");
      break;
    case EOpConstructI16Vec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i16vec2");
      break;
    case EOpConstructI16Vec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i16vec3");
      break;
    case EOpConstructI16Vec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i16vec4");
      break;
    case EOpConstructU16Vec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u16vec2");
      break;
    case EOpConstructU16Vec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u16vec3");
      break;
    case EOpConstructU16Vec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u16vec4");
      break;
    case EOpConstructIVec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct ivec2");
      break;
    case EOpConstructIVec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct ivec3");
      break;
    case EOpConstructIVec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct ivec4");
      break;
    case EOpConstructUVec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct uvec2");
      break;
    case EOpConstructUVec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct uvec3");
      break;
    case EOpConstructUVec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct uvec4");
      break;
    case EOpConstructI64Vec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i64vec2");
      break;
    case EOpConstructI64Vec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i64vec3");
      break;
    case EOpConstructI64Vec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct i64vec4");
      break;
    case EOpConstructU64Vec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u64vec2");
      break;
    case EOpConstructU64Vec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u64vec3");
      break;
    case EOpConstructU64Vec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct u64vec4");
      break;
    case EOpConstructDMat2x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat2");
      break;
    case EOpConstructDMat2x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat2x3");
      break;
    case EOpConstructDMat2x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat2x4");
      break;
    case EOpConstructDMat3x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat3x2");
      break;
    case EOpConstructDMat3x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat3");
      break;
    case EOpConstructDMat3x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat3x4");
      break;
    case EOpConstructDMat4x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat4x2");
      break;
    case EOpConstructDMat4x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat4x3");
      break;
    case EOpConstructDMat4x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct dmat4");
      break;
    case EOpConstructIMat2x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat2");
      break;
    case EOpConstructIMat2x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat2x3");
      break;
    case EOpConstructIMat2x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat2x4");
      break;
    case EOpConstructIMat3x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat3x2");
      break;
    case EOpConstructIMat3x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat3");
      break;
    case EOpConstructIMat3x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat3x4");
      break;
    case EOpConstructIMat4x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat4x2");
      break;
    case EOpConstructIMat4x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat4x3");
      break;
    case EOpConstructIMat4x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct imat4");
      break;
    case EOpConstructUMat2x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat2");
      break;
    case EOpConstructUMat2x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat2x3");
      break;
    case EOpConstructUMat2x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat2x4");
      break;
    case EOpConstructUMat3x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat3x2");
      break;
    case EOpConstructUMat3x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat3");
      break;
    case EOpConstructUMat3x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat3x4");
      break;
    case EOpConstructUMat4x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat4x2");
      break;
    case EOpConstructUMat4x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat4x3");
      break;
    case EOpConstructUMat4x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct umat4");
      break;
    case EOpConstructBMat2x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat2");
      break;
    case EOpConstructBMat2x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat2x3");
      break;
    case EOpConstructBMat2x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat2x4");
      break;
    case EOpConstructBMat3x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat3x2");
      break;
    case EOpConstructBMat3x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat3");
      break;
    case EOpConstructBMat3x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat3x4");
      break;
    case EOpConstructBMat4x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat4x2");
      break;
    case EOpConstructBMat4x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat4x3");
      break;
    case EOpConstructBMat4x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct bmat4");
      break;
    case EOpConstructFloat16:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct float16_t");
      break;
    case EOpConstructF16Vec2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16vec2");
      break;
    case EOpConstructF16Vec3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16vec3");
      break;
    case EOpConstructF16Vec4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16vec4");
      break;
    case EOpConstructF16Mat2x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat2");
      break;
    case EOpConstructF16Mat2x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat2x3");
      break;
    case EOpConstructF16Mat2x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat2x4");
      break;
    case EOpConstructF16Mat3x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat3x2");
      break;
    case EOpConstructF16Mat3x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat3");
      break;
    case EOpConstructF16Mat3x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat3x4");
      break;
    case EOpConstructF16Mat4x2:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat4x2");
      break;
    case EOpConstructF16Mat4x3:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat4x3");
      break;
    case EOpConstructF16Mat4x4:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct f16mat4");
      break;
    case EOpConstructStruct:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct structure");
      break;
    case EOpConstructTextureSampler:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct combined texture-sampler");
      break;
    case EOpConstructReference:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct reference");
      break;
    case EOpConstructCooperativeMatrixNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct cooperative matrix NV");
      break;
    case EOpConstructCooperativeMatrixKHR:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct cooperative matrix KHR");
      break;
    case EOpConstructCooperativeVectorNV:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct cooperative vector NV");
      break;
    case EOpConstructAccStruct:
      TInfoSinkBase::operator<<(&local_30->debug,"Construct acceleration structure");
      break;
    case EOpImageQuerySize:
      TInfoSinkBase::operator<<(&local_30->debug,"imageQuerySize");
      break;
    case EOpImageQuerySamples:
      TInfoSinkBase::operator<<(&local_30->debug,"imageQuerySamples");
      break;
    case EOpImageLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"imageLoad");
      break;
    case EOpImageStore:
      TInfoSinkBase::operator<<(&local_30->debug,"imageStore");
      break;
    case EOpImageLoadLod:
      TInfoSinkBase::operator<<(&local_30->debug,"imageLoadLod");
      break;
    case EOpImageStoreLod:
      TInfoSinkBase::operator<<(&local_30->debug,"imageStoreLod");
      break;
    case EOpImageAtomicAdd:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicAdd");
      break;
    case EOpImageAtomicMin:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicMin");
      break;
    case EOpImageAtomicMax:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicMax");
      break;
    case EOpImageAtomicAnd:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicAnd");
      break;
    case EOpImageAtomicOr:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicOr");
      break;
    case EOpImageAtomicXor:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicXor");
      break;
    case EOpImageAtomicExchange:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicExchange");
      break;
    case EOpImageAtomicCompSwap:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicCompSwap");
      break;
    case EOpImageAtomicLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicLoad");
      break;
    case EOpImageAtomicStore:
      TInfoSinkBase::operator<<(&local_30->debug,"imageAtomicStore");
      break;
    case EOpSubpassLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"subpassLoad");
      break;
    case EOpSubpassLoadMS:
      TInfoSinkBase::operator<<(&local_30->debug,"subpassLoadMS");
      break;
    case EOpSparseImageLoad:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseImageLoad");
      break;
    case EOpSparseImageLoadLod:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseImageLoadLod");
      break;
    case EOpColorAttachmentReadEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"colorAttachmentReadEXT");
      break;
    case EOpTextureQuerySize:
      TInfoSinkBase::operator<<(&local_30->debug,"textureSize");
      break;
    case EOpTextureQueryLod:
      TInfoSinkBase::operator<<(&local_30->debug,"textureQueryLod");
      break;
    case EOpTextureQueryLevels:
      TInfoSinkBase::operator<<(&local_30->debug,"textureQueryLevels");
      break;
    case EOpTextureQuerySamples:
      TInfoSinkBase::operator<<(&local_30->debug,"textureSamples");
      break;
    case EOpTexture:
      TInfoSinkBase::operator<<(&local_30->debug,"texture");
      break;
    case EOpTextureProj:
      TInfoSinkBase::operator<<(&local_30->debug,"textureProj");
      break;
    case EOpTextureLod:
      TInfoSinkBase::operator<<(&local_30->debug,"textureLod");
      break;
    case EOpTextureOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureOffset");
      break;
    case EOpTextureFetch:
      TInfoSinkBase::operator<<(&local_30->debug,"textureFetch");
      break;
    case EOpTextureFetchOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureFetchOffset");
      break;
    case EOpTextureProjOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureProjOffset");
      break;
    case EOpTextureLodOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureLodOffset");
      break;
    case EOpTextureProjLod:
      TInfoSinkBase::operator<<(&local_30->debug,"textureProjLod");
      break;
    case EOpTextureProjLodOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureProjLodOffset");
      break;
    case EOpTextureGrad:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGrad");
      break;
    case EOpTextureGradOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGradOffset");
      break;
    case EOpTextureProjGrad:
      TInfoSinkBase::operator<<(&local_30->debug,"textureProjGrad");
      break;
    case EOpTextureProjGradOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureProjGradOffset");
      break;
    case EOpTextureGather:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGather");
      break;
    case EOpTextureGatherOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGatherOffset");
      break;
    case EOpTextureGatherOffsets:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGatherOffsets");
      break;
    case EOpTextureClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"textureClamp");
      break;
    case EOpTextureOffsetClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"textureOffsetClamp");
      break;
    case EOpTextureGradClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGradClamp");
      break;
    case EOpTextureGradOffsetClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGradOffsetClamp");
      break;
    case EOpTextureGatherLod:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGatherLod");
      break;
    case EOpTextureGatherLodOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGatherLodOffset");
      break;
    case EOpTextureGatherLodOffsets:
      TInfoSinkBase::operator<<(&local_30->debug,"textureGatherLodOffsets");
      break;
    case EOpSparseTexture:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTexture");
      break;
    case EOpSparseTextureLod:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureLod");
      break;
    case EOpSparseTextureOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureOffset");
      break;
    case EOpSparseTextureFetch:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTexelFetch");
      break;
    case EOpSparseTextureFetchOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTexelFetchOffset");
      break;
    case EOpSparseTextureLodOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureLodOffset");
      break;
    case EOpSparseTextureGrad:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGrad");
      break;
    case EOpSparseTextureGradOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGradOffset");
      break;
    case EOpSparseTextureGather:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGather");
      break;
    case EOpSparseTextureGatherOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGatherOffset");
      break;
    case EOpSparseTextureGatherOffsets:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGatherOffsets");
      break;
    case EOpSparseTextureClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureClamp");
      break;
    case EOpSparseTextureOffsetClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureOffsetClamp");
      break;
    case EOpSparseTextureGradClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGradClamp");
      break;
    case EOpSparseTextureGradOffsetClamp:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGradOffsetClam");
      break;
    case EOpSparseTextureGatherLod:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGatherLod");
      break;
    case EOpSparseTextureGatherLodOffset:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGatherLodOffset");
      break;
    case EOpSparseTextureGatherLodOffsets:
      TInfoSinkBase::operator<<(&local_30->debug,"sparseTextureGatherLodOffsets");
      break;
    case EOpImageSampleFootprintNV:
      TInfoSinkBase::operator<<(&local_30->debug,"imageSampleFootprintNV");
      break;
    case EOpImageSampleFootprintClampNV:
      TInfoSinkBase::operator<<(&local_30->debug,"imageSampleFootprintClampNV");
      break;
    case EOpImageSampleFootprintLodNV:
      TInfoSinkBase::operator<<(&local_30->debug,"imageSampleFootprintLodNV");
      break;
    case EOpImageSampleFootprintGradNV:
      TInfoSinkBase::operator<<(&local_30->debug,"imageSampleFootprintGradNV");
      break;
    case EOpImageSampleFootprintGradClampNV:
      TInfoSinkBase::operator<<(&local_30->debug,"mageSampleFootprintGradClampNV");
      break;
    case EOpAddCarry:
      TInfoSinkBase::operator<<(&local_30->debug,"addCarry");
      break;
    case EOpSubBorrow:
      TInfoSinkBase::operator<<(&local_30->debug,"subBorrow");
      break;
    case EOpUMulExtended:
      TInfoSinkBase::operator<<(&local_30->debug,"uMulExtended");
      break;
    case EOpIMulExtended:
      TInfoSinkBase::operator<<(&local_30->debug,"iMulExtended");
      break;
    case EOpBitfieldExtract:
      TInfoSinkBase::operator<<(&local_30->debug,"bitfieldExtract");
      break;
    case EOpBitfieldInsert:
      TInfoSinkBase::operator<<(&local_30->debug,"bitfieldInsert");
      break;
    case EOpTraceNV:
      TInfoSinkBase::operator<<(&local_30->debug,"traceNV");
      break;
    case EOpTraceRayMotionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"traceRayMotionNV");
      break;
    case EOpTraceKHR:
      TInfoSinkBase::operator<<(&local_30->debug,"traceRayKHR");
      break;
    case EOpReportIntersection:
      TInfoSinkBase::operator<<(&local_30->debug,"reportIntersectionNV");
      break;
    case EOpIgnoreIntersectionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"ignoreIntersectionNV");
      break;
    case EOpTerminateRayNV:
      TInfoSinkBase::operator<<(&local_30->debug,"terminateRayNV");
      break;
    case EOpExecuteCallableNV:
      TInfoSinkBase::operator<<(&local_30->debug,"executeCallableNV");
      break;
    case EOpExecuteCallableKHR:
      TInfoSinkBase::operator<<(&local_30->debug,"executeCallableKHR");
      break;
    case EOpWritePackedPrimitiveIndices4x8NV:
      TInfoSinkBase::operator<<(&local_30->debug,"writePackedPrimitiveIndices4x8NV");
      break;
    case EOpEmitMeshTasksEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"EmitMeshTasksEXT");
      break;
    case EOpSetMeshOutputsEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"SetMeshOutputsEXT");
      break;
    case EOpRayQueryInitialize:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryInitializeEXT");
      break;
    case EOpRayQueryTerminate:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryTerminateEXT");
      break;
    case EOpRayQueryGenerateIntersection:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGenerateIntersectionEXT");
      break;
    case EOpRayQueryConfirmIntersection:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryConfirmIntersectionEXT");
      break;
    case EOpRayQueryProceed:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryProceedEXT");
      break;
    case EOpRayQueryGetIntersectionType:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionTypeEXT");
      break;
    case EOpRayQueryGetRayTMin:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetRayTMinEXT");
      break;
    case EOpRayQueryGetRayFlags:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetRayFlagsEXT");
      break;
    case EOpRayQueryGetIntersectionT:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionTEXT");
      break;
    case EOpRayQueryGetIntersectionInstanceCustomIndex:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionInstanceCustomIndexEXT");
      break;
    case EOpRayQueryGetIntersectionInstanceId:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionInstanceIdEXT");
      break;
    case EOpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffset:
      TInfoSinkBase::operator<<
                (&local_30->debug,"rayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetEXT"
                );
      break;
    case EOpRayQueryGetIntersectionGeometryIndex:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionGeometryIndexEXT");
      break;
    case EOpRayQueryGetIntersectionPrimitiveIndex:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionPrimitiveIndexEXT");
      break;
    case EOpRayQueryGetIntersectionBarycentrics:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionBarycentricsEXT");
      break;
    case EOpRayQueryGetIntersectionFrontFace:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionFrontFaceEXT");
      break;
    case EOpRayQueryGetIntersectionCandidateAABBOpaque:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionCandidateAABBOpaqueEXT");
      break;
    case EOpRayQueryGetIntersectionObjectRayDirection:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionObjectRayDirectionEXT");
      break;
    case EOpRayQueryGetIntersectionObjectRayOrigin:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionObjectRayOriginEXT");
      break;
    case EOpRayQueryGetWorldRayDirection:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetWorldRayDirectionEXT");
      break;
    case EOpRayQueryGetWorldRayOrigin:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetWorldRayOriginEXT");
      break;
    case EOpRayQueryGetIntersectionObjectToWorld:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionObjectToWorldEXT");
      break;
    case EOpRayQueryGetIntersectionWorldToObject:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionWorldToObjectEXT");
      break;
    case EOpHitObjectTraceRayNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectTraceRayNV");
      break;
    case EOpHitObjectTraceRayMotionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectTraceRayMotionNV");
      break;
    case EOpHitObjectRecordHitNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectRecordHitNV");
      break;
    case EOpHitObjectRecordHitMotionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectRecordHitMotionNV");
      break;
    case EOpHitObjectRecordHitWithIndexNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectRecordHitWithIndexNV");
      break;
    case EOpHitObjectRecordHitWithIndexMotionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectRecordHitWithIndexMotionNV");
      break;
    case EOpHitObjectRecordMissNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectRecordMissNV");
      break;
    case EOpHitObjectRecordMissMotionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectRecordMissMotionNV");
      break;
    case EOpHitObjectRecordEmptyNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectRecordEmptyNV");
      break;
    case EOpHitObjectExecuteShaderNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectExecuteShaderNV");
      break;
    case EOpHitObjectIsEmptyNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectIsEmptyNV");
      break;
    case EOpHitObjectIsMissNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectIsMissNV");
      break;
    case EOpHitObjectIsHitNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectIsHitNV");
      break;
    case EOpHitObjectGetRayTMinNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetRayTMinNV");
      break;
    case EOpHitObjectGetRayTMaxNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetRayTMaxNV");
      break;
    case EOpHitObjectGetObjectRayOriginNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetObjectRayOriginNV");
      break;
    case EOpHitObjectGetObjectRayDirectionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetObjectRayDirectionNV");
      break;
    case EOpHitObjectGetWorldRayOriginNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetWorldRayOriginNV");
      break;
    case EOpHitObjectGetWorldRayDirectionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetWorldRayDirectionNV");
      break;
    case EOpHitObjectGetWorldToObjectNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetWorldToObjectNV");
      break;
    case EOpHitObjectGetObjectToWorldNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetObjectToWorldNV");
      break;
    case EOpHitObjectGetInstanceCustomIndexNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetInstanceCustomIndexNV");
      break;
    case EOpHitObjectGetInstanceIdNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetInstaneIdNV");
      break;
    case EOpHitObjectGetGeometryIndexNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetGeometryIndexNV");
      break;
    case EOpHitObjectGetPrimitiveIndexNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetPrimitiveIndexNV");
      break;
    case EOpHitObjectGetHitKindNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetHitKindNV");
      break;
    case EOpHitObjectGetShaderBindingTableRecordIndexNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetShaderBindingTableRecordIndexNV");
      break;
    case EOpHitObjectGetShaderRecordBufferHandleNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectReadShaderRecordBufferHandleNV");
      break;
    case EOpHitObjectGetAttributesNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetAttributesNV");
      break;
    case EOpHitObjectGetCurrentTimeNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetCurrentTimeNV");
      break;
    case EOpReorderThreadNV:
      TInfoSinkBase::operator<<(&local_30->debug,"ReorderThreadNV");
      break;
    case EOpFetchMicroTriangleVertexPositionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"MicroTriangleVertexPositionNV");
      break;
    case EOpFetchMicroTriangleVertexBarycentricNV:
      TInfoSinkBase::operator<<(&local_30->debug,"MicroTriangleVertexBarycentricNV");
      break;
    case EOpSinCos:
      TInfoSinkBase::operator<<(&local_30->debug,"sincos");
      break;
    case EOpGenMul:
      TInfoSinkBase::operator<<(&local_30->debug,"mul");
      break;
    case EOpAllMemoryBarrierWithGroupSync:
      TInfoSinkBase::operator<<(&local_30->debug,"AllMemoryBarrierWithGroupSync");
      break;
    case EOpDeviceMemoryBarrier:
      TInfoSinkBase::operator<<(&local_30->debug,"DeviceMemoryBarrier");
      break;
    case EOpDeviceMemoryBarrierWithGroupSync:
      TInfoSinkBase::operator<<(&local_30->debug,"DeviceMemoryBarrierWithGroupSync");
      break;
    case EOpWorkgroupMemoryBarrier:
      TInfoSinkBase::operator<<(&local_30->debug,"WorkgroupMemoryBarrier");
      break;
    case EOpWorkgroupMemoryBarrierWithGroupSync:
      TInfoSinkBase::operator<<(&local_30->debug,"WorkgroupMemoryBarrierWithGroupSync");
      break;
    case EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:
      TInfoSinkBase::operator<<
                (&local_30->debug,"rayQueryGetIntersectionTriangleVertexPositionsEXT");
      break;
    case EOpStencilAttachmentReadEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"stencilAttachmentReadEXT");
      break;
    case EOpDepthAttachmentReadEXT:
      TInfoSinkBase::operator<<(&local_30->debug,"depthAttachmentReadEXT");
      break;
    case EOpRayQueryGetIntersectionClusterIdNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionClusterIdNV");
      break;
    case EOpHitObjectGetClusterIdNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetClusterIdNV");
      break;
    case EOpRayQueryGetIntersectionSpherePositionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionSpherePositionNV");
      break;
    case EOpRayQueryGetIntersectionSphereRadiusNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionSphereRadiusNV");
      break;
    case EOpRayQueryGetIntersectionLSSHitValueNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionLSSHitValueNV");
      break;
    case EOpRayQueryGetIntersectionLSSPositionsNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionLSSPositionsNV");
      break;
    case EOpRayQueryGetIntersectionLSSRadiiNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryGetIntersectionLSSRadiiNV");
      break;
    case EOpRayQueryIsSphereHitNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryIsSphereHitNV");
      break;
    case EOpRayQueryIsLSSHitNV:
      TInfoSinkBase::operator<<(&local_30->debug,"rayQueryIsLSSHitNV");
      break;
    case EOpHitObjectGetSpherePositionNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetSpherePositionNV");
      break;
    case EOpHitObjectGetSphereRadiusNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetSphereRadiusNV");
      break;
    case EOpHitObjectGetLSSPositionsNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetLSSPositionsNV");
      break;
    case EOpHitObjectGetLSSRadiiNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectGetLSSRadiiNV");
      break;
    case EOpHitObjectIsSphereHitNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectIsSphereHitNV");
      break;
    case EOpHitObjectIsLSSHitNV:
      TInfoSinkBase::operator<<(&local_30->debug,"HitObjectIsLSSHitNV");
    }
    TVar1 = TIntermOperator::getOp((TIntermOperator *)out);
    if (((TVar1 != EOpSequence) &&
        (TVar1 = TIntermOperator::getOp((TIntermOperator *)out), TVar1 != EOpScope)) &&
       (TVar1 = TIntermOperator::getOp((TIntermOperator *)out), TVar1 != EOpParameters)) {
      pTVar3 = TInfoSinkBase::operator<<(&local_30->debug," (");
      TIntermOperator::getCompleteString_abi_cxx11_(&local_58,(TIntermOperator *)out);
      pTVar3 = TInfoSinkBase::operator<<(pTVar3,&local_58);
      TInfoSinkBase::operator<<(pTVar3,")");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_58);
    }
    TInfoSinkBase::operator<<(&local_30->debug,"\n");
    return true;
  }
  TInfoSinkBase::message(&local_30->debug,EPrefixError,"node is still EOpNull!");
  return true;
}

Assistant:

bool TOutputTraverser::visitAggregate(TVisit /* visit */, TIntermAggregate* node)
{
    TInfoSink& out = infoSink;

    if (node->getOp() == EOpNull) {
        out.debug.message(EPrefixError, "node is still EOpNull!");
        return true;
    }

    OutputTreeText(out, node, depth);

    switch (node->getOp()) {
    case EOpSequence:      out.debug << "Sequence\n";       return true;
    case EOpScope:         out.debug << "Scope\n";       return true;
    case EOpLinkerObjects: out.debug << "Linker Objects\n"; return true;
    case EOpComma:         out.debug << "Comma";            break;
    case EOpFunction:      out.debug << "Function Definition: " << node->getName(); break;
    case EOpFunctionCall:  out.debug << "Function Call: "       << node->getName(); break;
    case EOpParameters:    out.debug << "Function Parameters: ";                    break;

    case EOpConstructFloat: out.debug << "Construct float"; break;
    case EOpConstructDouble:out.debug << "Construct double"; break;

    case EOpConstructVec2:  out.debug << "Construct vec2";  break;
    case EOpConstructVec3:  out.debug << "Construct vec3";  break;
    case EOpConstructVec4:  out.debug << "Construct vec4";  break;
    case EOpConstructDVec2: out.debug << "Construct dvec2";  break;
    case EOpConstructDVec3: out.debug << "Construct dvec3";  break;
    case EOpConstructDVec4: out.debug << "Construct dvec4";  break;
    case EOpConstructBool:  out.debug << "Construct bool";  break;
    case EOpConstructBVec2: out.debug << "Construct bvec2"; break;
    case EOpConstructBVec3: out.debug << "Construct bvec3"; break;
    case EOpConstructBVec4: out.debug << "Construct bvec4"; break;
    case EOpConstructInt8:   out.debug << "Construct int8_t";   break;
    case EOpConstructI8Vec2: out.debug << "Construct i8vec2"; break;
    case EOpConstructI8Vec3: out.debug << "Construct i8vec3"; break;
    case EOpConstructI8Vec4: out.debug << "Construct i8vec4"; break;
    case EOpConstructInt:   out.debug << "Construct int";   break;
    case EOpConstructIVec2: out.debug << "Construct ivec2"; break;
    case EOpConstructIVec3: out.debug << "Construct ivec3"; break;
    case EOpConstructIVec4: out.debug << "Construct ivec4"; break;
    case EOpConstructUint8:    out.debug << "Construct uint8_t";    break;
    case EOpConstructU8Vec2:   out.debug << "Construct u8vec2";   break;
    case EOpConstructU8Vec3:   out.debug << "Construct u8vec3";   break;
    case EOpConstructU8Vec4:   out.debug << "Construct u8vec4";   break;
    case EOpConstructUint:    out.debug << "Construct uint";    break;
    case EOpConstructUVec2:   out.debug << "Construct uvec2";   break;
    case EOpConstructUVec3:   out.debug << "Construct uvec3";   break;
    case EOpConstructUVec4:   out.debug << "Construct uvec4";   break;
    case EOpConstructInt64:   out.debug << "Construct int64"; break;
    case EOpConstructI64Vec2: out.debug << "Construct i64vec2"; break;
    case EOpConstructI64Vec3: out.debug << "Construct i64vec3"; break;
    case EOpConstructI64Vec4: out.debug << "Construct i64vec4"; break;
    case EOpConstructUint64:  out.debug << "Construct uint64"; break;
    case EOpConstructU64Vec2: out.debug << "Construct u64vec2"; break;
    case EOpConstructU64Vec3: out.debug << "Construct u64vec3"; break;
    case EOpConstructU64Vec4: out.debug << "Construct u64vec4"; break;
    case EOpConstructInt16:   out.debug << "Construct int16_t"; break;
    case EOpConstructI16Vec2: out.debug << "Construct i16vec2"; break;
    case EOpConstructI16Vec3: out.debug << "Construct i16vec3"; break;
    case EOpConstructI16Vec4: out.debug << "Construct i16vec4"; break;
    case EOpConstructUint16:  out.debug << "Construct uint16_t"; break;
    case EOpConstructU16Vec2: out.debug << "Construct u16vec2"; break;
    case EOpConstructU16Vec3: out.debug << "Construct u16vec3"; break;
    case EOpConstructU16Vec4: out.debug << "Construct u16vec4"; break;
    case EOpConstructMat2x2:  out.debug << "Construct mat2";    break;
    case EOpConstructMat2x3:  out.debug << "Construct mat2x3";  break;
    case EOpConstructMat2x4:  out.debug << "Construct mat2x4";  break;
    case EOpConstructMat3x2:  out.debug << "Construct mat3x2";  break;
    case EOpConstructMat3x3:  out.debug << "Construct mat3";    break;
    case EOpConstructMat3x4:  out.debug << "Construct mat3x4";  break;
    case EOpConstructMat4x2:  out.debug << "Construct mat4x2";  break;
    case EOpConstructMat4x3:  out.debug << "Construct mat4x3";  break;
    case EOpConstructMat4x4:  out.debug << "Construct mat4";    break;
    case EOpConstructDMat2x2: out.debug << "Construct dmat2";   break;
    case EOpConstructDMat2x3: out.debug << "Construct dmat2x3"; break;
    case EOpConstructDMat2x4: out.debug << "Construct dmat2x4"; break;
    case EOpConstructDMat3x2: out.debug << "Construct dmat3x2"; break;
    case EOpConstructDMat3x3: out.debug << "Construct dmat3";   break;
    case EOpConstructDMat3x4: out.debug << "Construct dmat3x4"; break;
    case EOpConstructDMat4x2: out.debug << "Construct dmat4x2"; break;
    case EOpConstructDMat4x3: out.debug << "Construct dmat4x3"; break;
    case EOpConstructDMat4x4: out.debug << "Construct dmat4";   break;
    case EOpConstructIMat2x2: out.debug << "Construct imat2";   break;
    case EOpConstructIMat2x3: out.debug << "Construct imat2x3"; break;
    case EOpConstructIMat2x4: out.debug << "Construct imat2x4"; break;
    case EOpConstructIMat3x2: out.debug << "Construct imat3x2"; break;
    case EOpConstructIMat3x3: out.debug << "Construct imat3";   break;
    case EOpConstructIMat3x4: out.debug << "Construct imat3x4"; break;
    case EOpConstructIMat4x2: out.debug << "Construct imat4x2"; break;
    case EOpConstructIMat4x3: out.debug << "Construct imat4x3"; break;
    case EOpConstructIMat4x4: out.debug << "Construct imat4";   break;
    case EOpConstructUMat2x2: out.debug << "Construct umat2";   break;
    case EOpConstructUMat2x3: out.debug << "Construct umat2x3"; break;
    case EOpConstructUMat2x4: out.debug << "Construct umat2x4"; break;
    case EOpConstructUMat3x2: out.debug << "Construct umat3x2"; break;
    case EOpConstructUMat3x3: out.debug << "Construct umat3";   break;
    case EOpConstructUMat3x4: out.debug << "Construct umat3x4"; break;
    case EOpConstructUMat4x2: out.debug << "Construct umat4x2"; break;
    case EOpConstructUMat4x3: out.debug << "Construct umat4x3"; break;
    case EOpConstructUMat4x4: out.debug << "Construct umat4";   break;
    case EOpConstructBMat2x2: out.debug << "Construct bmat2";   break;
    case EOpConstructBMat2x3: out.debug << "Construct bmat2x3"; break;
    case EOpConstructBMat2x4: out.debug << "Construct bmat2x4"; break;
    case EOpConstructBMat3x2: out.debug << "Construct bmat3x2"; break;
    case EOpConstructBMat3x3: out.debug << "Construct bmat3";   break;
    case EOpConstructBMat3x4: out.debug << "Construct bmat3x4"; break;
    case EOpConstructBMat4x2: out.debug << "Construct bmat4x2"; break;
    case EOpConstructBMat4x3: out.debug << "Construct bmat4x3"; break;
    case EOpConstructBMat4x4: out.debug << "Construct bmat4";   break;
    case EOpConstructFloat16:   out.debug << "Construct float16_t"; break;
    case EOpConstructF16Vec2:   out.debug << "Construct f16vec2";   break;
    case EOpConstructF16Vec3:   out.debug << "Construct f16vec3";   break;
    case EOpConstructF16Vec4:   out.debug << "Construct f16vec4";   break;
    case EOpConstructF16Mat2x2: out.debug << "Construct f16mat2";   break;
    case EOpConstructF16Mat2x3: out.debug << "Construct f16mat2x3"; break;
    case EOpConstructF16Mat2x4: out.debug << "Construct f16mat2x4"; break;
    case EOpConstructF16Mat3x2: out.debug << "Construct f16mat3x2"; break;
    case EOpConstructF16Mat3x3: out.debug << "Construct f16mat3";   break;
    case EOpConstructF16Mat3x4: out.debug << "Construct f16mat3x4"; break;
    case EOpConstructF16Mat4x2: out.debug << "Construct f16mat4x2"; break;
    case EOpConstructF16Mat4x3: out.debug << "Construct f16mat4x3"; break;
    case EOpConstructF16Mat4x4: out.debug << "Construct f16mat4";   break;
    case EOpConstructStruct:  out.debug << "Construct structure";  break;
    case EOpConstructTextureSampler: out.debug << "Construct combined texture-sampler"; break;
    case EOpConstructReference:  out.debug << "Construct reference";  break;
    case EOpConstructCooperativeMatrixNV:  out.debug << "Construct cooperative matrix NV";  break;
    case EOpConstructCooperativeMatrixKHR:  out.debug << "Construct cooperative matrix KHR";  break;
    case EOpConstructCooperativeVectorNV:  out.debug << "Construct cooperative vector NV";  break;
    case EOpConstructAccStruct: out.debug << "Construct acceleration structure"; break;

    case EOpLessThan:         out.debug << "Compare Less Than";             break;
    case EOpGreaterThan:      out.debug << "Compare Greater Than";          break;
    case EOpLessThanEqual:    out.debug << "Compare Less Than or Equal";    break;
    case EOpGreaterThanEqual: out.debug << "Compare Greater Than or Equal"; break;
    case EOpVectorEqual:      out.debug << "Equal";                         break;
    case EOpVectorNotEqual:   out.debug << "NotEqual";                      break;

    case EOpMod:           out.debug << "mod";         break;
    case EOpModf:          out.debug << "modf";        break;
    case EOpPow:           out.debug << "pow";         break;

    case EOpAtan:          out.debug << "arc tangent"; break;

    case EOpMin:           out.debug << "min";         break;
    case EOpMax:           out.debug << "max";         break;
    case EOpClamp:         out.debug << "clamp";       break;
    case EOpMix:           out.debug << "mix";         break;
    case EOpStep:          out.debug << "step";        break;
    case EOpSmoothStep:    out.debug << "smoothstep";  break;

    case EOpDistance:      out.debug << "distance";                break;
    case EOpDot:           out.debug << "dot-product";             break;
    case EOpDotPackedEXT:  out.debug << "dot-product-packed";break;
    case EOpDotAccSatEXT:  out.debug << "dot-product-accumulate-saturate";break;
    case EOpDotPackedAccSatEXT:  out.debug << "dot-product-packed-accumulate-saturate";break;
    case EOpCross:         out.debug << "cross-product";           break;
    case EOpFaceForward:   out.debug << "face-forward";            break;
    case EOpReflect:       out.debug << "reflect";                 break;
    case EOpRefract:       out.debug << "refract";                 break;
    case EOpMul:           out.debug << "component-wise multiply"; break;
    case EOpOuterProduct:  out.debug << "outer product";           break;

    case EOpEmitVertex:    out.debug << "EmitVertex";              break;
    case EOpEndPrimitive:  out.debug << "EndPrimitive";            break;

    case EOpBarrier:                    out.debug << "Barrier";                    break;
    case EOpMemoryBarrier:              out.debug << "MemoryBarrier";              break;
    case EOpMemoryBarrierAtomicCounter: out.debug << "MemoryBarrierAtomicCounter"; break;
    case EOpMemoryBarrierBuffer:        out.debug << "MemoryBarrierBuffer";        break;
    case EOpMemoryBarrierImage:         out.debug << "MemoryBarrierImage";         break;
    case EOpMemoryBarrierShared:        out.debug << "MemoryBarrierShared";        break;
    case EOpGroupMemoryBarrier:         out.debug << "GroupMemoryBarrier";         break;

    case EOpReadInvocation:             out.debug << "readInvocation";        break;

    case EOpSwizzleInvocations:         out.debug << "swizzleInvocations";       break;
    case EOpSwizzleInvocationsMasked:   out.debug << "swizzleInvocationsMasked"; break;
    case EOpWriteInvocation:            out.debug << "writeInvocation";          break;

    case EOpMin3:                       out.debug << "min3";                  break;
    case EOpMax3:                       out.debug << "max3";                  break;
    case EOpMid3:                       out.debug << "mid3";                  break;
    case EOpTime:                       out.debug << "time";                  break;

    case EOpAtomicAdd:                  out.debug << "AtomicAdd";             break;
    case EOpAtomicSubtract:             out.debug << "AtomicSubtract";        break;
    case EOpAtomicMin:                  out.debug << "AtomicMin";             break;
    case EOpAtomicMax:                  out.debug << "AtomicMax";             break;
    case EOpAtomicAnd:                  out.debug << "AtomicAnd";             break;
    case EOpAtomicOr:                   out.debug << "AtomicOr";              break;
    case EOpAtomicXor:                  out.debug << "AtomicXor";             break;
    case EOpAtomicExchange:             out.debug << "AtomicExchange";        break;
    case EOpAtomicCompSwap:             out.debug << "AtomicCompSwap";        break;
    case EOpAtomicLoad:                 out.debug << "AtomicLoad";            break;
    case EOpAtomicStore:                out.debug << "AtomicStore";           break;

    case EOpAtomicCounterAdd:           out.debug << "AtomicCounterAdd";      break;
    case EOpAtomicCounterSubtract:      out.debug << "AtomicCounterSubtract"; break;
    case EOpAtomicCounterMin:           out.debug << "AtomicCounterMin";      break;
    case EOpAtomicCounterMax:           out.debug << "AtomicCounterMax";      break;
    case EOpAtomicCounterAnd:           out.debug << "AtomicCounterAnd";      break;
    case EOpAtomicCounterOr:            out.debug << "AtomicCounterOr";       break;
    case EOpAtomicCounterXor:           out.debug << "AtomicCounterXor";      break;
    case EOpAtomicCounterExchange:      out.debug << "AtomicCounterExchange"; break;
    case EOpAtomicCounterCompSwap:      out.debug << "AtomicCounterCompSwap"; break;

    case EOpImageQuerySize:             out.debug << "imageQuerySize";        break;
    case EOpImageQuerySamples:          out.debug << "imageQuerySamples";     break;
    case EOpImageLoad:                  out.debug << "imageLoad";             break;
    case EOpImageStore:                 out.debug << "imageStore";            break;
    case EOpImageAtomicAdd:             out.debug << "imageAtomicAdd";        break;
    case EOpImageAtomicMin:             out.debug << "imageAtomicMin";        break;
    case EOpImageAtomicMax:             out.debug << "imageAtomicMax";        break;
    case EOpImageAtomicAnd:             out.debug << "imageAtomicAnd";        break;
    case EOpImageAtomicOr:              out.debug << "imageAtomicOr";         break;
    case EOpImageAtomicXor:             out.debug << "imageAtomicXor";        break;
    case EOpImageAtomicExchange:        out.debug << "imageAtomicExchange";   break;
    case EOpImageAtomicCompSwap:        out.debug << "imageAtomicCompSwap";   break;
    case EOpImageAtomicLoad:            out.debug << "imageAtomicLoad";       break;
    case EOpImageAtomicStore:           out.debug << "imageAtomicStore";      break;
    case EOpImageLoadLod:               out.debug << "imageLoadLod";          break;
    case EOpImageStoreLod:              out.debug << "imageStoreLod";         break;

    case EOpTextureQuerySize:           out.debug << "textureSize";           break;
    case EOpTextureQueryLod:            out.debug << "textureQueryLod";       break;
    case EOpTextureQueryLevels:         out.debug << "textureQueryLevels";    break;
    case EOpTextureQuerySamples:        out.debug << "textureSamples";        break;
    case EOpTexture:                    out.debug << "texture";               break;
    case EOpTextureProj:                out.debug << "textureProj";           break;
    case EOpTextureLod:                 out.debug << "textureLod";            break;
    case EOpTextureOffset:              out.debug << "textureOffset";         break;
    case EOpTextureFetch:               out.debug << "textureFetch";          break;
    case EOpTextureFetchOffset:         out.debug << "textureFetchOffset";    break;
    case EOpTextureProjOffset:          out.debug << "textureProjOffset";     break;
    case EOpTextureLodOffset:           out.debug << "textureLodOffset";      break;
    case EOpTextureProjLod:             out.debug << "textureProjLod";        break;
    case EOpTextureProjLodOffset:       out.debug << "textureProjLodOffset";  break;
    case EOpTextureGrad:                out.debug << "textureGrad";           break;
    case EOpTextureGradOffset:          out.debug << "textureGradOffset";     break;
    case EOpTextureProjGrad:            out.debug << "textureProjGrad";       break;
    case EOpTextureProjGradOffset:      out.debug << "textureProjGradOffset"; break;
    case EOpTextureGather:              out.debug << "textureGather";         break;
    case EOpTextureGatherOffset:        out.debug << "textureGatherOffset";   break;
    case EOpTextureGatherOffsets:       out.debug << "textureGatherOffsets";  break;
    case EOpTextureClamp:               out.debug << "textureClamp";          break;
    case EOpTextureOffsetClamp:         out.debug << "textureOffsetClamp";    break;
    case EOpTextureGradClamp:           out.debug << "textureGradClamp";      break;
    case EOpTextureGradOffsetClamp:     out.debug << "textureGradOffsetClamp";  break;
    case EOpTextureGatherLod:           out.debug << "textureGatherLod";        break;
    case EOpTextureGatherLodOffset:     out.debug << "textureGatherLodOffset";  break;
    case EOpTextureGatherLodOffsets:    out.debug << "textureGatherLodOffsets"; break;

    case EOpSparseTexture:                  out.debug << "sparseTexture";                   break;
    case EOpSparseTextureOffset:            out.debug << "sparseTextureOffset";             break;
    case EOpSparseTextureLod:               out.debug << "sparseTextureLod";                break;
    case EOpSparseTextureLodOffset:         out.debug << "sparseTextureLodOffset";          break;
    case EOpSparseTextureFetch:             out.debug << "sparseTexelFetch";                break;
    case EOpSparseTextureFetchOffset:       out.debug << "sparseTexelFetchOffset";          break;
    case EOpSparseTextureGrad:              out.debug << "sparseTextureGrad";               break;
    case EOpSparseTextureGradOffset:        out.debug << "sparseTextureGradOffset";         break;
    case EOpSparseTextureGather:            out.debug << "sparseTextureGather";             break;
    case EOpSparseTextureGatherOffset:      out.debug << "sparseTextureGatherOffset";       break;
    case EOpSparseTextureGatherOffsets:     out.debug << "sparseTextureGatherOffsets";      break;
    case EOpSparseImageLoad:                out.debug << "sparseImageLoad";                 break;
    case EOpSparseTextureClamp:             out.debug << "sparseTextureClamp";              break;
    case EOpSparseTextureOffsetClamp:       out.debug << "sparseTextureOffsetClamp";        break;
    case EOpSparseTextureGradClamp:         out.debug << "sparseTextureGradClamp";          break;
    case EOpSparseTextureGradOffsetClamp:   out.debug << "sparseTextureGradOffsetClam";     break;
    case EOpSparseTextureGatherLod:         out.debug << "sparseTextureGatherLod";          break;
    case EOpSparseTextureGatherLodOffset:   out.debug << "sparseTextureGatherLodOffset";    break;
    case EOpSparseTextureGatherLodOffsets:  out.debug << "sparseTextureGatherLodOffsets";   break;
    case EOpSparseImageLoadLod:             out.debug << "sparseImageLoadLod";              break;
    case EOpImageSampleFootprintNV:             out.debug << "imageSampleFootprintNV";          break;
    case EOpImageSampleFootprintClampNV:        out.debug << "imageSampleFootprintClampNV";     break;
    case EOpImageSampleFootprintLodNV:          out.debug << "imageSampleFootprintLodNV";       break;
    case EOpImageSampleFootprintGradNV:         out.debug << "imageSampleFootprintGradNV";      break;
    case EOpImageSampleFootprintGradClampNV:    out.debug << "mageSampleFootprintGradClampNV";  break;
    case EOpAddCarry:                   out.debug << "addCarry";              break;
    case EOpSubBorrow:                  out.debug << "subBorrow";             break;
    case EOpUMulExtended:               out.debug << "uMulExtended";          break;
    case EOpIMulExtended:               out.debug << "iMulExtended";          break;
    case EOpBitfieldExtract:            out.debug << "bitfieldExtract";       break;
    case EOpBitfieldInsert:             out.debug << "bitfieldInsert";        break;

    case EOpFma:                        out.debug << "fma";                   break;
    case EOpFrexp:                      out.debug << "frexp";                 break;
    case EOpLdexp:                      out.debug << "ldexp";                 break;

    case EOpInterpolateAtSample:   out.debug << "interpolateAtSample";    break;
    case EOpInterpolateAtOffset:   out.debug << "interpolateAtOffset";    break;
    case EOpInterpolateAtVertex:   out.debug << "interpolateAtVertex";    break;

    case EOpSinCos:                     out.debug << "sincos";                break;
    case EOpGenMul:                     out.debug << "mul";                   break;

    case EOpAllMemoryBarrierWithGroupSync:    out.debug << "AllMemoryBarrierWithGroupSync";    break;
    case EOpDeviceMemoryBarrier:              out.debug << "DeviceMemoryBarrier";              break;
    case EOpDeviceMemoryBarrierWithGroupSync: out.debug << "DeviceMemoryBarrierWithGroupSync"; break;
    case EOpWorkgroupMemoryBarrier:           out.debug << "WorkgroupMemoryBarrier";           break;
    case EOpWorkgroupMemoryBarrierWithGroupSync: out.debug << "WorkgroupMemoryBarrierWithGroupSync"; break;

    case EOpSubgroupBarrier:                 out.debug << "subgroupBarrier"; break;
    case EOpSubgroupMemoryBarrier:           out.debug << "subgroupMemoryBarrier"; break;
    case EOpSubgroupMemoryBarrierBuffer:     out.debug << "subgroupMemoryBarrierBuffer"; break;
    case EOpSubgroupMemoryBarrierImage:      out.debug << "subgroupMemoryBarrierImage";   break;
    case EOpSubgroupMemoryBarrierShared:     out.debug << "subgroupMemoryBarrierShared"; break;
    case EOpSubgroupElect:                   out.debug << "subgroupElect"; break;
    case EOpSubgroupAll:                     out.debug << "subgroupAll"; break;
    case EOpSubgroupAny:                     out.debug << "subgroupAny"; break;
    case EOpSubgroupAllEqual:                out.debug << "subgroupAllEqual"; break;
    case EOpSubgroupBroadcast:               out.debug << "subgroupBroadcast"; break;
    case EOpSubgroupBroadcastFirst:          out.debug << "subgroupBroadcastFirst"; break;
    case EOpSubgroupBallot:                  out.debug << "subgroupBallot"; break;
    case EOpSubgroupInverseBallot:           out.debug << "subgroupInverseBallot"; break;
    case EOpSubgroupBallotBitExtract:        out.debug << "subgroupBallotBitExtract"; break;
    case EOpSubgroupBallotBitCount:          out.debug << "subgroupBallotBitCount"; break;
    case EOpSubgroupBallotInclusiveBitCount: out.debug << "subgroupBallotInclusiveBitCount"; break;
    case EOpSubgroupBallotExclusiveBitCount: out.debug << "subgroupBallotExclusiveBitCount"; break;
    case EOpSubgroupBallotFindLSB:           out.debug << "subgroupBallotFindLSB"; break;
    case EOpSubgroupBallotFindMSB:           out.debug << "subgroupBallotFindMSB"; break;
    case EOpSubgroupShuffle:                 out.debug << "subgroupShuffle"; break;
    case EOpSubgroupShuffleXor:              out.debug << "subgroupShuffleXor"; break;
    case EOpSubgroupShuffleUp:               out.debug << "subgroupShuffleUp"; break;
    case EOpSubgroupShuffleDown:             out.debug << "subgroupShuffleDown"; break;
    case EOpSubgroupRotate:                  out.debug << "subgroupRotate"; break;
    case EOpSubgroupClusteredRotate:         out.debug << "subgroupClusteredRotate"; break;
    case EOpSubgroupAdd:                     out.debug << "subgroupAdd"; break;
    case EOpSubgroupMul:                     out.debug << "subgroupMul"; break;
    case EOpSubgroupMin:                     out.debug << "subgroupMin"; break;
    case EOpSubgroupMax:                     out.debug << "subgroupMax"; break;
    case EOpSubgroupAnd:                     out.debug << "subgroupAnd"; break;
    case EOpSubgroupOr:                      out.debug << "subgroupOr"; break;
    case EOpSubgroupXor:                     out.debug << "subgroupXor"; break;
    case EOpSubgroupInclusiveAdd:            out.debug << "subgroupInclusiveAdd"; break;
    case EOpSubgroupInclusiveMul:            out.debug << "subgroupInclusiveMul"; break;
    case EOpSubgroupInclusiveMin:            out.debug << "subgroupInclusiveMin"; break;
    case EOpSubgroupInclusiveMax:            out.debug << "subgroupInclusiveMax"; break;
    case EOpSubgroupInclusiveAnd:            out.debug << "subgroupInclusiveAnd"; break;
    case EOpSubgroupInclusiveOr:             out.debug << "subgroupInclusiveOr"; break;
    case EOpSubgroupInclusiveXor:            out.debug << "subgroupInclusiveXor"; break;
    case EOpSubgroupExclusiveAdd:            out.debug << "subgroupExclusiveAdd"; break;
    case EOpSubgroupExclusiveMul:            out.debug << "subgroupExclusiveMul"; break;
    case EOpSubgroupExclusiveMin:            out.debug << "subgroupExclusiveMin"; break;
    case EOpSubgroupExclusiveMax:            out.debug << "subgroupExclusiveMax"; break;
    case EOpSubgroupExclusiveAnd:            out.debug << "subgroupExclusiveAnd"; break;
    case EOpSubgroupExclusiveOr:             out.debug << "subgroupExclusiveOr"; break;
    case EOpSubgroupExclusiveXor:            out.debug << "subgroupExclusiveXor"; break;
    case EOpSubgroupClusteredAdd:            out.debug << "subgroupClusteredAdd"; break;
    case EOpSubgroupClusteredMul:            out.debug << "subgroupClusteredMul"; break;
    case EOpSubgroupClusteredMin:            out.debug << "subgroupClusteredMin"; break;
    case EOpSubgroupClusteredMax:            out.debug << "subgroupClusteredMax"; break;
    case EOpSubgroupClusteredAnd:            out.debug << "subgroupClusteredAnd"; break;
    case EOpSubgroupClusteredOr:             out.debug << "subgroupClusteredOr"; break;
    case EOpSubgroupClusteredXor:            out.debug << "subgroupClusteredXor"; break;
    case EOpSubgroupQuadBroadcast:           out.debug << "subgroupQuadBroadcast"; break;
    case EOpSubgroupQuadSwapHorizontal:      out.debug << "subgroupQuadSwapHorizontal"; break;
    case EOpSubgroupQuadSwapVertical:        out.debug << "subgroupQuadSwapVertical"; break;
    case EOpSubgroupQuadSwapDiagonal:        out.debug << "subgroupQuadSwapDiagonal"; break;
    case EOpSubgroupQuadAll:                 out.debug << "subgroupQuadAll"; break;
    case EOpSubgroupQuadAny:                 out.debug << "subgroupQuadAny"; break;

    case EOpSubgroupPartition:                          out.debug << "subgroupPartitionNV";                          break;
    case EOpSubgroupPartitionedAdd:                     out.debug << "subgroupPartitionedAddNV";                     break;
    case EOpSubgroupPartitionedMul:                     out.debug << "subgroupPartitionedMulNV";                     break;
    case EOpSubgroupPartitionedMin:                     out.debug << "subgroupPartitionedMinNV";                     break;
    case EOpSubgroupPartitionedMax:                     out.debug << "subgroupPartitionedMaxNV";                     break;
    case EOpSubgroupPartitionedAnd:                     out.debug << "subgroupPartitionedAndNV";                     break;
    case EOpSubgroupPartitionedOr:                      out.debug << "subgroupPartitionedOrNV";                      break;
    case EOpSubgroupPartitionedXor:                     out.debug << "subgroupPartitionedXorNV";                     break;
    case EOpSubgroupPartitionedInclusiveAdd:            out.debug << "subgroupPartitionedInclusiveAddNV";            break;
    case EOpSubgroupPartitionedInclusiveMul:            out.debug << "subgroupPartitionedInclusiveMulNV";            break;
    case EOpSubgroupPartitionedInclusiveMin:            out.debug << "subgroupPartitionedInclusiveMinNV";            break;
    case EOpSubgroupPartitionedInclusiveMax:            out.debug << "subgroupPartitionedInclusiveMaxNV";            break;
    case EOpSubgroupPartitionedInclusiveAnd:            out.debug << "subgroupPartitionedInclusiveAndNV";            break;
    case EOpSubgroupPartitionedInclusiveOr:             out.debug << "subgroupPartitionedInclusiveOrNV";             break;
    case EOpSubgroupPartitionedInclusiveXor:            out.debug << "subgroupPartitionedInclusiveXorNV";            break;
    case EOpSubgroupPartitionedExclusiveAdd:            out.debug << "subgroupPartitionedExclusiveAddNV";            break;
    case EOpSubgroupPartitionedExclusiveMul:            out.debug << "subgroupPartitionedExclusiveMulNV";            break;
    case EOpSubgroupPartitionedExclusiveMin:            out.debug << "subgroupPartitionedExclusiveMinNV";            break;
    case EOpSubgroupPartitionedExclusiveMax:            out.debug << "subgroupPartitionedExclusiveMaxNV";            break;
    case EOpSubgroupPartitionedExclusiveAnd:            out.debug << "subgroupPartitionedExclusiveAndNV";            break;
    case EOpSubgroupPartitionedExclusiveOr:             out.debug << "subgroupPartitionedExclusiveOrNV";             break;
    case EOpSubgroupPartitionedExclusiveXor:            out.debug << "subgroupPartitionedExclusiveXorNV";            break;

    case EOpSubpassLoad:   out.debug << "subpassLoad";   break;
    case EOpSubpassLoadMS: out.debug << "subpassLoadMS"; break;

    case EOpColorAttachmentReadEXT:   out.debug << "colorAttachmentReadEXT";   break;

    case EOpTraceNV:                          out.debug << "traceNV"; break;
    case EOpTraceRayMotionNV:                 out.debug << "traceRayMotionNV"; break;
    case EOpTraceKHR:                         out.debug << "traceRayKHR"; break;
    case EOpReportIntersection:               out.debug << "reportIntersectionNV"; break;
    case EOpIgnoreIntersectionNV:             out.debug << "ignoreIntersectionNV"; break;
    case EOpIgnoreIntersectionKHR:            out.debug << "ignoreIntersectionKHR"; break;
    case EOpTerminateRayNV:                   out.debug << "terminateRayNV"; break;
    case EOpTerminateRayKHR:                  out.debug << "terminateRayKHR"; break;
    case EOpExecuteCallableNV:                out.debug << "executeCallableNV"; break;
    case EOpExecuteCallableKHR:               out.debug << "executeCallableKHR"; break;
    case EOpWritePackedPrimitiveIndices4x8NV: out.debug << "writePackedPrimitiveIndices4x8NV"; break;
    case EOpEmitMeshTasksEXT:                 out.debug << "EmitMeshTasksEXT"; break;
    case EOpSetMeshOutputsEXT:                out.debug << "SetMeshOutputsEXT"; break;

    case EOpRayQueryInitialize:                                            out.debug << "rayQueryInitializeEXT"; break;
    case EOpRayQueryTerminate:                                             out.debug << "rayQueryTerminateEXT"; break;
    case EOpRayQueryGenerateIntersection:                                  out.debug << "rayQueryGenerateIntersectionEXT"; break;
    case EOpRayQueryConfirmIntersection:                                   out.debug << "rayQueryConfirmIntersectionEXT"; break;
    case EOpRayQueryProceed:                                               out.debug << "rayQueryProceedEXT"; break;
    case EOpRayQueryGetIntersectionType:                                   out.debug << "rayQueryGetIntersectionTypeEXT"; break;
    case EOpRayQueryGetRayTMin:                                            out.debug << "rayQueryGetRayTMinEXT"; break;
    case EOpRayQueryGetRayFlags:                                           out.debug << "rayQueryGetRayFlagsEXT"; break;
    case EOpRayQueryGetIntersectionT:                                      out.debug << "rayQueryGetIntersectionTEXT"; break;
    case EOpRayQueryGetIntersectionInstanceCustomIndex:                    out.debug << "rayQueryGetIntersectionInstanceCustomIndexEXT"; break;
    case EOpRayQueryGetIntersectionInstanceId:                             out.debug << "rayQueryGetIntersectionInstanceIdEXT"; break;
    case EOpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffset: out.debug << "rayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetEXT"; break;
    case EOpRayQueryGetIntersectionGeometryIndex:                          out.debug << "rayQueryGetIntersectionGeometryIndexEXT"; break;
    case EOpRayQueryGetIntersectionPrimitiveIndex:                         out.debug << "rayQueryGetIntersectionPrimitiveIndexEXT"; break;
    case EOpRayQueryGetIntersectionBarycentrics:                           out.debug << "rayQueryGetIntersectionBarycentricsEXT"; break;
    case EOpRayQueryGetIntersectionFrontFace:                              out.debug << "rayQueryGetIntersectionFrontFaceEXT"; break;
    case EOpRayQueryGetIntersectionCandidateAABBOpaque:                    out.debug << "rayQueryGetIntersectionCandidateAABBOpaqueEXT"; break;
    case EOpRayQueryGetIntersectionObjectRayDirection:                     out.debug << "rayQueryGetIntersectionObjectRayDirectionEXT"; break;
    case EOpRayQueryGetIntersectionObjectRayOrigin:                        out.debug << "rayQueryGetIntersectionObjectRayOriginEXT"; break;
    case EOpRayQueryGetWorldRayDirection:                                  out.debug << "rayQueryGetWorldRayDirectionEXT"; break;
    case EOpRayQueryGetWorldRayOrigin:                                     out.debug << "rayQueryGetWorldRayOriginEXT"; break;
    case EOpRayQueryGetIntersectionObjectToWorld:                          out.debug << "rayQueryGetIntersectionObjectToWorldEXT"; break;
    case EOpRayQueryGetIntersectionWorldToObject:                          out.debug << "rayQueryGetIntersectionWorldToObjectEXT"; break;
    case EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:             out.debug << "rayQueryGetIntersectionTriangleVertexPositionsEXT"; break;
    case EOpRayQueryGetIntersectionClusterIdNV:                            out.debug << "rayQueryGetIntersectionClusterIdNV"; break;
    case EOpRayQueryGetIntersectionSpherePositionNV:                       out.debug << "rayQueryGetIntersectionSpherePositionNV"; break;
    case EOpRayQueryGetIntersectionSphereRadiusNV:                         out.debug << "rayQueryGetIntersectionSphereRadiusNV"; break;
    case EOpRayQueryGetIntersectionLSSHitValueNV:                          out.debug << "rayQueryGetIntersectionLSSHitValueNV"; break;
    case EOpRayQueryGetIntersectionLSSPositionsNV:                         out.debug << "rayQueryGetIntersectionLSSPositionsNV"; break;
    case EOpRayQueryGetIntersectionLSSRadiiNV:                             out.debug << "rayQueryGetIntersectionLSSRadiiNV"; break;
    case EOpRayQueryIsSphereHitNV:                                         out.debug << "rayQueryIsSphereHitNV"; break;
    case EOpRayQueryIsLSSHitNV:                                            out.debug << "rayQueryIsLSSHitNV"; break;

    case EOpCooperativeMatrixLoad:  out.debug << "Load cooperative matrix KHR"; break;
    case EOpCooperativeMatrixStore:  out.debug << "Store cooperative matrix KHR"; break;
    case EOpCooperativeMatrixMulAdd: out.debug << "MulAdd cooperative matrices KHR"; break;
    case EOpCooperativeMatrixLoadNV:  out.debug << "Load cooperative matrix NV"; break;
    case EOpCooperativeMatrixStoreNV:  out.debug << "Store cooperative matrix NV"; break;
    case EOpCooperativeMatrixLoadTensorNV:  out.debug << "Load cooperative matrix tensor NV"; break;
    case EOpCooperativeMatrixStoreTensorNV:  out.debug << "Store cooperative matrix tensor NV"; break;
    case EOpCooperativeMatrixMulAddNV: out.debug << "MulAdd cooperative matrices NV"; break;
    case EOpCooperativeMatrixReduceNV: out.debug << "Reduce cooperative matrices"; break;
    case EOpCooperativeMatrixPerElementOpNV: out.debug << "cooperative matrix per element op"; break;
    case EOpCooperativeMatrixTransposeNV: out.debug << "Transpose cooperative matrix"; break;

    case EOpCooperativeVectorMatMulNV: out.debug << "Cooperative vector matrix multiply NV"; break;
    case EOpCooperativeVectorMatMulAddNV: out.debug << "Cooperative vector matrix multiply add NV"; break;
    case EOpCooperativeVectorLoadNV:  out.debug << "Load cooperative vector NV"; break;
    case EOpCooperativeVectorStoreNV:  out.debug << "Store cooperative vector NV"; break;
    case EOpCooperativeVectorOuterProductAccumulateNV: out.debug << "Cooperative vector outer product accumulate NV"; break;
    case EOpCooperativeVectorReduceSumAccumulateNV: out.debug << "Cooperative vector reduce sum accumulate NV"; break;

    case EOpIsHelperInvocation: out.debug << "IsHelperInvocation"; break;
    case EOpDebugPrintf:  out.debug << "Debug printf";  break;

    case EOpHitObjectTraceRayNV: out.debug << "HitObjectTraceRayNV"; break;
    case EOpHitObjectTraceRayMotionNV: out.debug << "HitObjectTraceRayMotionNV"; break;
    case EOpHitObjectRecordHitNV: out.debug << "HitObjectRecordHitNV"; break;
    case EOpHitObjectRecordHitMotionNV: out.debug << "HitObjectRecordHitMotionNV"; break;
    case EOpHitObjectRecordHitWithIndexNV: out.debug << "HitObjectRecordHitWithIndexNV"; break;
    case EOpHitObjectRecordHitWithIndexMotionNV: out.debug << "HitObjectRecordHitWithIndexMotionNV"; break;
    case EOpHitObjectRecordMissNV: out.debug << "HitObjectRecordMissNV"; break;
    case EOpHitObjectRecordMissMotionNV: out.debug << "HitObjectRecordMissMotionNV"; break;
    case EOpHitObjectRecordEmptyNV: out.debug << "HitObjectRecordEmptyNV"; break;
    case EOpHitObjectExecuteShaderNV: out.debug << "HitObjectExecuteShaderNV"; break;
    case EOpHitObjectIsEmptyNV: out.debug << "HitObjectIsEmptyNV"; break;
    case EOpHitObjectIsMissNV: out.debug << "HitObjectIsMissNV"; break;
    case EOpHitObjectIsHitNV:  out.debug << "HitObjectIsHitNV"; break;
    case EOpHitObjectGetRayTMinNV: out.debug << "HitObjectGetRayTMinNV"; break;
    case EOpHitObjectGetRayTMaxNV: out.debug << "HitObjectGetRayTMaxNV"; break;
    case EOpHitObjectGetObjectRayOriginNV: out.debug << "HitObjectGetObjectRayOriginNV"; break;
    case EOpHitObjectGetObjectRayDirectionNV: out.debug << "HitObjectGetObjectRayDirectionNV"; break;
    case EOpHitObjectGetWorldRayOriginNV: out.debug << "HitObjectGetWorldRayOriginNV"; break;
    case EOpHitObjectGetWorldRayDirectionNV: out.debug << "HitObjectGetWorldRayDirectionNV"; break;
    case EOpHitObjectGetObjectToWorldNV: out.debug << "HitObjectGetObjectToWorldNV"; break;
    case EOpHitObjectGetWorldToObjectNV: out.debug << "HitObjectGetWorldToObjectNV"; break;
    case EOpHitObjectGetInstanceCustomIndexNV: out.debug<< "HitObjectGetInstanceCustomIndexNV"; break;
    case EOpHitObjectGetInstanceIdNV: out.debug << "HitObjectGetInstaneIdNV"; break;
    case EOpHitObjectGetGeometryIndexNV: out.debug << "HitObjectGetGeometryIndexNV"; break;
    case EOpHitObjectGetPrimitiveIndexNV: out.debug << "HitObjectGetPrimitiveIndexNV"; break;
    case EOpHitObjectGetHitKindNV: out.debug << "HitObjectGetHitKindNV"; break;
    case EOpHitObjectGetAttributesNV: out.debug << "HitObjectGetAttributesNV"; break;
    case EOpHitObjectGetCurrentTimeNV: out.debug << "HitObjectGetCurrentTimeNV"; break;
    case EOpHitObjectGetShaderBindingTableRecordIndexNV: out.debug << "HitObjectGetShaderBindingTableRecordIndexNV"; break;
    case EOpHitObjectGetShaderRecordBufferHandleNV: out.debug << "HitObjectReadShaderRecordBufferHandleNV"; break;
    case EOpHitObjectGetClusterIdNV: out.debug << "HitObjectGetClusterIdNV"; break;
    case EOpReorderThreadNV: out.debug << "ReorderThreadNV"; break;
    case EOpFetchMicroTriangleVertexPositionNV: out.debug << "MicroTriangleVertexPositionNV"; break;
    case EOpFetchMicroTriangleVertexBarycentricNV: out.debug << "MicroTriangleVertexBarycentricNV"; break;
    case EOpHitObjectGetSpherePositionNV: out.debug << "HitObjectGetSpherePositionNV"; break;
    case EOpHitObjectGetSphereRadiusNV:   out.debug << "HitObjectGetSphereRadiusNV"; break;
    case EOpHitObjectGetLSSPositionsNV:   out.debug << "HitObjectGetLSSPositionsNV"; break;
    case EOpHitObjectGetLSSRadiiNV:       out.debug << "HitObjectGetLSSRadiiNV"; break;
    case EOpHitObjectIsSphereHitNV:       out.debug << "HitObjectIsSphereHitNV"; break;
    case EOpHitObjectIsLSSHitNV:          out.debug << "HitObjectIsLSSHitNV"; break;

    case EOpSpirvInst: out.debug << "spirv_instruction"; break;
    case EOpStencilAttachmentReadEXT: out.debug << "stencilAttachmentReadEXT"; break;
    case EOpDepthAttachmentReadEXT: out.debug << "depthAttachmentReadEXT"; break;

    case EOpCreateTensorLayoutNV:           out.debug << "createTensorLayout"; break;
    case EOpTensorLayoutSetBlockSizeNV:     out.debug << "setBlockSize"; break;
    case EOpTensorLayoutSetDimensionNV:     out.debug << "setDimension"; break;
    case EOpTensorLayoutSetStrideNV:        out.debug << "setStride"; break;
    case EOpTensorLayoutSliceNV:            out.debug << "slice"; break;
    case EOpTensorLayoutSetClampValueNV:    out.debug << "setClampValue"; break;
    case EOpCreateTensorViewNV:             out.debug << "createTensorView"; break;
    case EOpTensorViewSetDimensionNV:       out.debug << "setTensorViewDimensions"; break;
    case EOpTensorViewSetStrideNV:          out.debug << "setTensorViewStride"; break;
    case EOpTensorViewSetClipNV:            out.debug << "clipTensorView"; break;

    default: out.debug.message(EPrefixError, "Bad aggregation op");
    }

    if (node->getOp() != EOpSequence && node->getOp() != EOpScope && node->getOp() != EOpParameters)
        out.debug << " (" << node->getCompleteString() << ")";

    out.debug << "\n";

    return true;
}